

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O1

size_t __thiscall AddrManImpl::Size_(AddrManImpl *this,optional<Network> net,optional<bool> in_new)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  ulong uVar4;
  int *piVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  long in_FS_OFFSET;
  
  if (((ulong)net.super__Optional_base<Network,_true,_true>._M_payload.
              super__Optional_payload_base<Network> & 0x100000000) == 0) {
    if (((ushort)in_new.super__Optional_base<bool,_true,_true>._M_payload.
                 super__Optional_payload_base<bool> & 0x100) == 0) {
      p_Var3 = (_Hash_node_base *)
               ((long)(this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3);
    }
    else {
      piVar5 = &this->nNew;
      if (((ushort)in_new.super__Optional_base<bool,_true,_true>._M_payload.
                   super__Optional_payload_base<bool> & 1) == 0) {
        piVar5 = &this->nTried;
      }
      p_Var3 = (_Hash_node_base *)(long)*piVar5;
    }
  }
  else {
    uVar1 = (this->m_network_counts)._M_h._M_bucket_count;
    uVar4 = ((ulong)net.super__Optional_base<Network,_true,_true>._M_payload.
                    super__Optional_payload_base<Network> & 0xffffffff) % uVar1;
    p_Var6 = (this->m_network_counts)._M_h._M_buckets[uVar4];
    p_Var7 = (__node_base_ptr)0x0;
    if ((p_Var6 != (__node_base_ptr)0x0) &&
       (p_Var2 = p_Var6->_M_nxt, p_Var7 = p_Var6,
       *(Network *)&p_Var6->_M_nxt[1]._M_nxt !=
       net.super__Optional_base<Network,_true,_true>._M_payload.
       super__Optional_payload_base<Network>._M_payload)) {
      while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
        p_Var7 = (__node_base_ptr)0x0;
        if (((ulong)*(Network *)&p_Var2[1]._M_nxt % uVar1 != uVar4) ||
           (p_Var7 = p_Var6,
           *(Network *)&p_Var2[1]._M_nxt ==
           net.super__Optional_base<Network,_true,_true>._M_payload.
           super__Optional_payload_base<Network>._M_payload)) goto LAB_0085e53e;
      }
      p_Var7 = (__node_base_ptr)0x0;
    }
LAB_0085e53e:
    if (p_Var7 == (__node_base_ptr)0x0) {
      p_Var2 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var2 = p_Var7->_M_nxt;
    }
    if (p_Var2 == (_Hash_node_base *)0x0) {
      p_Var3 = (_Hash_node_base *)0x0;
    }
    else if (((ushort)in_new.super__Optional_base<bool,_true,_true>._M_payload.
                      super__Optional_payload_base<bool> & 0x100) == 0) {
      p_Var3 = (_Hash_node_base *)
               ((long)&(p_Var2[2]._M_nxt)->_M_nxt + (long)&(p_Var2[3]._M_nxt)->_M_nxt);
    }
    else {
      p_Var3 = p_Var2[3]._M_nxt;
      if (((ushort)in_new.super__Optional_base<bool,_true,_true>._M_payload.
                   super__Optional_payload_base<bool> & 1) != 0) {
        p_Var3 = p_Var2[2]._M_nxt;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return (size_t)p_Var3;
}

Assistant:

size_t AddrManImpl::Size_(std::optional<Network> net, std::optional<bool> in_new) const
{
    AssertLockHeld(cs);

    if (!net.has_value()) {
        if (in_new.has_value()) {
            return *in_new ? nNew : nTried;
        } else {
            return vRandom.size();
        }
    }
    if (auto it = m_network_counts.find(*net); it != m_network_counts.end()) {
        auto net_count = it->second;
        if (in_new.has_value()) {
            return *in_new ? net_count.n_new : net_count.n_tried;
        } else {
            return net_count.n_new + net_count.n_tried;
        }
    }
    return 0;
}